

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_zip(DisasContext_conflict1 *s,arg_rrr_esz *a,_Bool high)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint oprsz;
  uint32_t dofs;
  int iVar2;
  int iVar3;
  uint local_34;
  uint high_ofs;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool high_local;
  arg_rrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    if (high) {
      local_34 = oprsz >> 1;
    }
    else {
      local_34 = 0;
    }
    dofs = vec_full_reg_offset(s,a->rd);
    iVar2 = vec_full_reg_offset(s,a->rn);
    iVar3 = vec_full_reg_offset(s,a->rm);
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx_00,dofs,iVar2 + local_34,iVar3 + local_34,oprsz,oprsz,0,
               (gen_helper_gvec_3_conflict1 *)do_zip::fns[a->esz]);
  }
  return true;
}

Assistant:

static bool do_zip(DisasContext *s, arg_rrr_esz *a, bool high)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[4] = {
        gen_helper_sve_zip_b, gen_helper_sve_zip_h,
        gen_helper_sve_zip_s, gen_helper_sve_zip_d,
    };

    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        unsigned high_ofs = high ? vsz / 2 : 0;
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn) + high_ofs,
                           vec_full_reg_offset(s, a->rm) + high_ofs,
                           vsz, vsz, 0, fns[a->esz]);
    }
    return true;
}